

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ParseStageMetaOpt(AsciiParser *this)

{
  bool bVar1;
  ostream *poVar2;
  reference __x;
  value_type *this_00;
  value_type_conflict6 *pvVar3;
  value_type_conflict1 *pvVar4;
  value_type *this_01;
  reference this_02;
  string *psVar5;
  value_type *pvVar6;
  value_type *pvVar7;
  string *psVar8;
  string local_22d8;
  ostringstream local_22b8 [8];
  ostringstream ss_w_1;
  string local_2140;
  allocator local_2119;
  string local_2118 [32];
  fmt local_20f8 [32];
  ostringstream local_20d8 [8];
  ostringstream ss_e_14;
  undefined1 local_1f60 [8];
  StringData sdata_1;
  undefined1 local_1f08 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pvs_1;
  undefined1 local_1ea8 [8];
  optional<tinyusdz::value::StringData> pv_10;
  ostringstream local_1e50 [8];
  ostringstream ss_e_13;
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_1cd8;
  undefined1 local_1ca0 [8];
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  pv_9;
  ostringstream local_1c48 [8];
  ostringstream ss_e_12;
  string local_1ad0;
  ostringstream local_1ab0 [8];
  ostringstream ss_e_11;
  Token *item_1;
  iterator __end14;
  iterator __begin14;
  value_type *__range14;
  undefined1 local_18f8 [8];
  optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> pv_8;
  optional<double> local_18c8;
  undefined1 local_18b8 [8];
  optional<double> pvd_5;
  optional<double> local_18a0;
  optional<float> local_1890;
  optional<float> local_1888;
  optional<float> pv_7;
  optional<double> local_1870;
  undefined1 local_1860 [8];
  optional<double> pvd_4;
  optional<double> local_1848;
  optional<float> local_1838;
  optional<float> local_1830;
  optional<float> pv_6;
  optional<double> local_1818;
  undefined1 local_1808 [8];
  optional<double> pvd_3;
  optional<double> local_17f0;
  optional<float> local_17e0;
  optional<float> local_17d8;
  optional<float> pv_5;
  ostringstream local_17b0 [8];
  ostringstream ss_e_10;
  optional<double> local_1638;
  optional<double> local_1628;
  undefined1 local_1618 [8];
  optional<double> pvd_2;
  optional<double> local_1600;
  optional<float> local_15f0;
  optional<float> local_15e8;
  optional<float> pv_4;
  ostringstream local_15c0 [8];
  ostringstream ss_e_9;
  optional<double> local_1448;
  optional<double> local_1438;
  undefined1 local_1428 [8];
  optional<double> pvd_1;
  optional<double> local_1410;
  optional<float> local_1400;
  optional<float> local_13f8;
  optional<float> pv_3;
  ostringstream local_13d0 [8];
  ostringstream ss_e_8;
  optional<double> local_1258;
  optional<double> local_1248;
  undefined1 local_1238 [8];
  optional<double> pvd;
  optional<double> local_1220;
  optional<float> local_1210;
  optional<float> local_1208;
  optional<float> pv_2;
  allocator local_11d9;
  string local_11d8 [32];
  fmt local_11b8 [32];
  ostringstream local_1198 [8];
  ostringstream ss_e_7;
  undefined1 local_1020 [8];
  StringData sdata;
  undefined1 local_fc8 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pvs;
  undefined1 local_f68 [8];
  optional<tinyusdz::value::StringData> pv_1;
  ostringstream local_f10 [8];
  ostringstream ss_e_6;
  Axis local_d94;
  optional<tinyusdz::Axis> local_d90;
  string local_d88;
  string local_d68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d48 [32];
  ostringstream local_d28 [8];
  ostringstream ss_w;
  string local_bb0;
  string local_b90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b70 [32];
  ostringstream local_b50 [8];
  ostringstream ss_e_5;
  Axis local_9d4;
  optional<tinyusdz::Axis> local_9d0;
  Axis local_9c8;
  optional<tinyusdz::Axis> local_9c4;
  Axis local_9bc;
  optional<tinyusdz::Axis> local_9b8;
  string local_9b0 [8];
  string s;
  undefined1 local_968 [8];
  optional<tinyusdz::Token> pv;
  ostringstream local_920 [8];
  ostringstream ss_e_4;
  AssetPath *item;
  iterator __end5;
  iterator __begin5;
  vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *__range5;
  vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> paths;
  ostringstream local_750 [8];
  ostringstream ss_e_3;
  undefined1 local_5d8 [8];
  token tok;
  ostringstream local_598 [8];
  ostringstream ss_e_2;
  undefined1 local_420 [8];
  MetaVariable var;
  VariableDef *vardef;
  ostringstream local_3c0 [8];
  ostringstream ss_e_1;
  string local_248;
  ostringstream local_228 [8];
  ostringstream ss_e;
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [8];
  string msg;
  string varname;
  undefined1 local_48 [8];
  StringData str;
  AsciiParser *this_local;
  
  str._40_8_ = this;
  tinyusdz::value::StringData::StringData((StringData *)local_48);
  bVar1 = MaybeTripleQuotedString(this,(StringData *)local_48);
  if (bVar1) {
    tinyusdz::value::StringData::operator=(&(this->_stage_metas).comment,(StringData *)local_48);
    this_local._7_1_ = 1;
    bVar1 = true;
  }
  else {
    bVar1 = MaybeString(this,(StringData *)local_48);
    if (bVar1) {
      tinyusdz::value::StringData::operator=(&(this->_stage_metas).comment,(StringData *)local_48);
      this_local._7_1_ = 1;
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  tinyusdz::value::StringData::~StringData((StringData *)local_48);
  if (bVar1) goto LAB_0054398e;
  ::std::__cxx11::string::string((string *)(msg.field_2._M_local_buf + 8));
  bVar1 = ReadIdentifier(this,(string *)((long)&msg.field_2 + 8));
  if (bVar1) {
    bVar1 = IsStageMeta(this,(string *)((long)&msg.field_2 + 8));
    if (bVar1) {
      bVar1 = Expect(this,'=');
      if (bVar1) {
        bVar1 = SkipWhitespace(this);
        if (bVar1) {
          var._name.field_2._8_8_ =
               ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
               ::at(&this->_supported_stage_metas,(key_type *)((long)&msg.field_2 + 8));
          MetaVariable::MetaVariable((MetaVariable *)local_420);
          bVar1 = ParseMetaValue(this,(VariableDef *)var._name.field_2._8_8_,
                                 (MetaVariable *)local_420);
          if (bVar1) {
            MetaVariable::set_name((MetaVariable *)local_420,(string *)((long)&msg.field_2 + 8));
            bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(msg.field_2._M_local_buf + 8),"defaultPrim");
            if (bVar1) {
              Token::Token((Token *)local_5d8);
              bVar1 = MetaVariable::get_value<tinyusdz::Token>
                                ((MetaVariable *)local_420,(Token *)local_5d8);
              if (bVar1) {
                Token::operator=(&(this->_stage_metas).defaultPrim,(Token *)local_5d8);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_750);
                poVar2 = ::std::operator<<((ostream *)local_750,"[error]");
                poVar2 = ::std::operator<<(poVar2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar2 = ::std::operator<<(poVar2,":");
                poVar2 = ::std::operator<<(poVar2,"ParseStageMetaOpt");
                poVar2 = ::std::operator<<(poVar2,"():");
                poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x728);
                ::std::operator<<(poVar2," ");
                poVar2 = ::std::operator<<((ostream *)local_750,
                                           "`defaultPrim` isn\'t a token value.");
                ::std::operator<<(poVar2,"\n");
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)
                               &paths.
                                super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                ::std::__cxx11::string::~string
                          ((string *)
                           &paths.
                            super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_750);
              }
              Token::~Token((Token *)local_5d8);
              if (bVar1) goto LAB_0054396e;
            }
            else {
              bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(msg.field_2._M_local_buf + 8),"subLayers");
              if (bVar1) {
                ::std::
                vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
                vector((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                        *)&__range5);
                bVar1 = MetaVariable::
                        get_value<std::vector<tinyusdz::value::AssetPath,std::allocator<tinyusdz::value::AssetPath>>>
                                  ((MetaVariable *)local_420,
                                   (vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                    *)&__range5);
                if (bVar1) {
                  __end5 = ::std::
                           vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                           ::begin((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                    *)&__range5);
                  item = (AssetPath *)
                         ::std::
                         vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                         ::end((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                *)&__range5);
                  while (bVar1 = __gnu_cxx::operator!=
                                           (&__end5,(
                                                  __normal_iterator<tinyusdz::value::AssetPath_*,_std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>_>
                                                  *)&item), bVar1) {
                    __x = __gnu_cxx::
                          __normal_iterator<tinyusdz::value::AssetPath_*,_std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>_>
                          ::operator*(&__end5);
                    ::std::
                    vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                    ::push_back(&(this->_stage_metas).subLayers,__x);
                    __gnu_cxx::
                    __normal_iterator<tinyusdz::value::AssetPath_*,_std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>_>
                    ::operator++(&__end5);
                  }
                  bVar1 = false;
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(local_920);
                  poVar2 = ::std::operator<<((ostream *)local_920,"[error]");
                  poVar2 = ::std::operator<<(poVar2,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                            );
                  poVar2 = ::std::operator<<(poVar2,":");
                  poVar2 = ::std::operator<<(poVar2,"ParseStageMetaOpt");
                  poVar2 = ::std::operator<<(poVar2,"():");
                  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x732);
                  ::std::operator<<(poVar2," ");
                  poVar2 = ::std::operator<<((ostream *)local_920,
                                             "`subLayers` isn\'t an array of asset path");
                  ::std::operator<<(poVar2,"\n");
                  ::std::__cxx11::ostringstream::str();
                  PushError(this,(string *)((long)&pv.contained + 0x18));
                  ::std::__cxx11::string::~string((string *)((long)&pv.contained + 0x18));
                  this_local._7_1_ = 0;
                  bVar1 = true;
                  ::std::__cxx11::ostringstream::~ostringstream(local_920);
                }
                ::std::
                vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
                ~vector((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                         *)&__range5);
joined_r0x00541ce9:
                if (bVar1) goto LAB_00543979;
              }
              else {
                bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)(msg.field_2._M_local_buf + 8),"upAxis");
                if (bVar1) {
                  MetaVariable::get_value<tinyusdz::Token>
                            ((optional<tinyusdz::Token> *)((long)&s.field_2 + 8),
                             (MetaVariable *)local_420);
                  nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
                            ((optional<tinyusdz::Token> *)local_968,
                             (optional<tinyusdz::Token> *)((long)&s.field_2 + 8));
                  nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                            ((optional<tinyusdz::Token> *)((long)&s.field_2 + 8));
                  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                    ((optional *)local_968);
                  if (bVar1) {
                    this_00 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                                        ((optional<tinyusdz::Token> *)local_968);
                    psVar5 = Token::str_abi_cxx11_(this_00);
                    ::std::__cxx11::string::string(local_9b0,(string *)psVar5);
                    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_9b0,"X");
                    if (bVar1) {
                      local_9bc = X;
                      nonstd::optional_lite::optional<tinyusdz::Axis>::optional<tinyusdz::Axis,_0>
                                (&local_9b8,&local_9bc);
                      nonstd::optional_lite::optional<tinyusdz::Axis>::operator=
                                (&(this->_stage_metas).upAxis,&local_9b8);
                      nonstd::optional_lite::optional<tinyusdz::Axis>::~optional(&local_9b8);
LAB_00542165:
                      bVar1 = false;
                    }
                    else {
                      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_9b0,"Y");
                      if (bVar1) {
                        local_9c8 = Y;
                        nonstd::optional_lite::optional<tinyusdz::Axis>::optional<tinyusdz::Axis,_0>
                                  (&local_9c4,&local_9c8);
                        nonstd::optional_lite::optional<tinyusdz::Axis>::operator=
                                  (&(this->_stage_metas).upAxis,&local_9c4);
                        nonstd::optional_lite::optional<tinyusdz::Axis>::~optional(&local_9c4);
                        goto LAB_00542165;
                      }
                      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_9b0,"Z");
                      if (bVar1) {
                        local_9d4 = Z;
                        nonstd::optional_lite::optional<tinyusdz::Axis>::optional<tinyusdz::Axis,_0>
                                  (&local_9d0,&local_9d4);
                        nonstd::optional_lite::optional<tinyusdz::Axis>::operator=
                                  (&(this->_stage_metas).upAxis,&local_9d0);
                        nonstd::optional_lite::optional<tinyusdz::Axis>::~optional(&local_9d0);
                        goto LAB_00542165;
                      }
                      if (((this->_option).strict_allowedToken_check & 1U) == 0) {
                        ::std::__cxx11::ostringstream::ostringstream(local_d28);
                        poVar2 = ::std::operator<<((ostream *)local_d28,"[warn]");
                        poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                        poVar2 = ::std::operator<<(poVar2,":");
                        poVar2 = ::std::operator<<(poVar2,"ParseStageMetaOpt");
                        poVar2 = ::std::operator<<(poVar2,"():");
                        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x749);
                        ::std::operator<<(poVar2," ");
                        ::std::operator+((char *)local_d68,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)
                                         "Ignore unknown `upAxis` value. Must be \"X\", \"Y\" or \"Z\", but got \""
                                        );
                        ::std::operator+(local_d48,(char *)local_d68);
                        poVar2 = ::std::operator<<((ostream *)local_d28,(string *)local_d48);
                        ::std::operator<<(poVar2,"\n");
                        ::std::__cxx11::string::~string((string *)local_d48);
                        ::std::__cxx11::string::~string(local_d68);
                        ::std::__cxx11::ostringstream::str();
                        PushWarn(this,&local_d88);
                        ::std::__cxx11::string::~string((string *)&local_d88);
                        ::std::__cxx11::ostringstream::~ostringstream(local_d28);
                        local_d94 = Y;
                        nonstd::optional_lite::optional<tinyusdz::Axis>::optional<tinyusdz::Axis,_0>
                                  (&local_d90,&local_d94);
                        nonstd::optional_lite::optional<tinyusdz::Axis>::operator=
                                  (&(this->_stage_metas).upAxis,&local_d90);
                        nonstd::optional_lite::optional<tinyusdz::Axis>::~optional(&local_d90);
                        goto LAB_00542165;
                      }
                      ::std::__cxx11::ostringstream::ostringstream(local_b50);
                      poVar2 = ::std::operator<<((ostream *)local_b50,"[error]");
                      poVar2 = ::std::operator<<(poVar2,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                );
                      poVar2 = ::std::operator<<(poVar2,":");
                      poVar2 = ::std::operator<<(poVar2,"ParseStageMetaOpt");
                      poVar2 = ::std::operator<<(poVar2,"():");
                      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x743);
                      ::std::operator<<(poVar2," ");
                      ::std::operator+((char *)local_b90,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)
                                       "Invalid `upAxis` value. Must be \"X\", \"Y\" or \"Z\", but got \""
                                      );
                      ::std::operator+(local_b70,(char *)local_b90);
                      poVar2 = ::std::operator<<((ostream *)local_b50,(string *)local_b70);
                      ::std::operator<<(poVar2,"\n");
                      ::std::__cxx11::string::~string((string *)local_b70);
                      ::std::__cxx11::string::~string(local_b90);
                      ::std::__cxx11::ostringstream::str();
                      PushError(this,&local_bb0);
                      ::std::__cxx11::string::~string((string *)&local_bb0);
                      this_local._7_1_ = 0;
                      bVar1 = true;
                      ::std::__cxx11::ostringstream::~ostringstream(local_b50);
                    }
                    ::std::__cxx11::string::~string(local_9b0);
                    if (!bVar1) {
                      bVar1 = false;
                    }
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream(local_f10);
                    poVar2 = ::std::operator<<((ostream *)local_f10,"[error]");
                    poVar2 = ::std::operator<<(poVar2,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                              );
                    poVar2 = ::std::operator<<(poVar2,":");
                    poVar2 = ::std::operator<<(poVar2,"ParseStageMetaOpt");
                    poVar2 = ::std::operator<<(poVar2,"():");
                    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x74e);
                    ::std::operator<<(poVar2," ");
                    poVar2 = ::std::operator<<((ostream *)local_f10,"`upAxis` isn\'t a token value."
                                              );
                    ::std::operator<<(poVar2,"\n");
                    ::std::__cxx11::ostringstream::str();
                    PushError(this,(string *)((long)&pv_1.contained + 0x28));
                    ::std::__cxx11::string::~string((string *)((long)&pv_1.contained + 0x28));
                    this_local._7_1_ = 0;
                    bVar1 = true;
                    ::std::__cxx11::ostringstream::~ostringstream(local_f10);
                  }
                  nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                            ((optional<tinyusdz::Token> *)local_968);
                  goto joined_r0x00541ce9;
                }
                bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)(msg.field_2._M_local_buf + 8),"doc");
                if ((bVar1) ||
                   (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)(msg.field_2._M_local_buf + 8),"documentation"),
                   bVar1)) {
                  MetaVariable::get_value<tinyusdz::value::StringData>
                            ((optional<tinyusdz::value::StringData> *)((long)&pvs.contained + 0x18),
                             (MetaVariable *)local_420);
                  nonstd::optional_lite::optional<tinyusdz::value::StringData>::
                  optional<tinyusdz::value::StringData,_0>
                            ((optional<tinyusdz::value::StringData> *)local_f68,
                             (optional<tinyusdz::value::StringData> *)((long)&pvs.contained + 0x18))
                  ;
                  nonstd::optional_lite::optional<tinyusdz::value::StringData>::~optional
                            ((optional<tinyusdz::value::StringData> *)((long)&pvs.contained + 0x18))
                  ;
                  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                    ((optional *)local_f68);
                  if (bVar1) {
                    pvVar7 = nonstd::optional_lite::optional<tinyusdz::value::StringData>::value
                                       ((optional<tinyusdz::value::StringData> *)local_f68);
                    tinyusdz::value::StringData::operator=(&(this->_stage_metas).doc,pvVar7);
LAB_00542537:
                    bVar1 = false;
                  }
                  else {
                    MetaVariable::get_value<std::__cxx11::string>
                              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&sdata.line_col,(MetaVariable *)local_420);
                    nonstd::optional_lite::
                    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::
                    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_fc8,
                               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&sdata.line_col);
                    nonstd::optional_lite::
                    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&sdata.line_col);
                    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                      ((optional *)local_fc8);
                    if (bVar1) {
                      tinyusdz::value::StringData::StringData((StringData *)local_1020);
                      psVar8 = (string *)
                               nonstd::optional_lite::
                               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_fc8);
                      ::std::__cxx11::string::operator=((string *)local_1020,psVar8);
                      sdata.value.field_2._M_local_buf[8] = '\0';
                      tinyusdz::value::StringData::operator=
                                (&(this->_stage_metas).doc,(StringData *)local_1020);
                      tinyusdz::value::StringData::~StringData((StringData *)local_1020);
                    }
                    else {
                      ::std::__cxx11::ostringstream::ostringstream(local_1198);
                      poVar2 = ::std::operator<<((ostream *)local_1198,"[error]");
                      poVar2 = ::std::operator<<(poVar2,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                );
                      poVar2 = ::std::operator<<(poVar2,":");
                      poVar2 = ::std::operator<<(poVar2,"ParseStageMetaOpt");
                      poVar2 = ::std::operator<<(poVar2,"():");
                      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x75b);
                      ::std::operator<<(poVar2," ");
                      ::std::allocator<char>::allocator();
                      ::std::__cxx11::string::string
                                (local_11d8,"`{}` isn\'t a string value.",&local_11d9);
                      fmt::format<std::__cxx11::string>
                                (local_11b8,(string *)local_11d8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(msg.field_2._M_local_buf + 8));
                      poVar2 = ::std::operator<<((ostream *)local_1198,(string *)local_11b8);
                      ::std::operator<<(poVar2,"\n");
                      ::std::__cxx11::string::~string((string *)local_11b8);
                      ::std::__cxx11::string::~string(local_11d8);
                      ::std::allocator<char>::~allocator((allocator<char> *)&local_11d9);
                      ::std::__cxx11::ostringstream::str();
                      PushError(this,(string *)&pv_2);
                      ::std::__cxx11::string::~string((string *)&pv_2);
                      this_local._7_1_ = 0;
                      ::std::__cxx11::ostringstream::~ostringstream(local_1198);
                    }
                    bVar1 = !bVar1;
                    nonstd::optional_lite::
                    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_fc8);
                    if (!bVar1) goto LAB_00542537;
                  }
                  nonstd::optional_lite::optional<tinyusdz::value::StringData>::~optional
                            ((optional<tinyusdz::value::StringData> *)local_f68);
                  if (bVar1) goto LAB_00543979;
                }
                else {
                  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)(msg.field_2._M_local_buf + 8),"metersPerUnit");
                  if (bVar1) {
                    MetaVariable::get_value<float>(&local_1210,(MetaVariable *)local_420);
                    nonstd::optional_lite::optional<float>::optional<float,_0>
                              (&local_1208,&local_1210);
                    nonstd::optional_lite::optional<float>::~optional(&local_1210);
                    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                      ((optional *)&local_1208);
                    if (bVar1) {
                      pvVar3 = nonstd::optional_lite::optional<float>::value(&local_1208);
                      pvd.contained = (storage_t<double>)(double)*pvVar3;
                      nonstd::optional_lite::optional<double>::optional<double,_0>
                                (&local_1220,(double *)&pvd.contained);
                      nonstd::optional_lite::optional<double>::operator=
                                (&(this->_stage_metas).metersPerUnit,&local_1220);
                      nonstd::optional_lite::optional<double>::~optional(&local_1220);
LAB_005427a9:
                      bVar1 = false;
                    }
                    else {
                      MetaVariable::get_value<double>(&local_1248,(MetaVariable *)local_420);
                      nonstd::optional_lite::optional<double>::optional<double,_0>
                                ((optional<double> *)local_1238,&local_1248);
                      nonstd::optional_lite::optional<double>::~optional(&local_1248);
                      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                        ((optional *)local_1238);
                      if (bVar1) {
                        pvVar4 = nonstd::optional_lite::optional<double>::value
                                           ((optional<double> *)local_1238);
                        nonstd::optional_lite::optional<double>::optional<double_&,_0>
                                  (&local_1258,pvVar4);
                        nonstd::optional_lite::optional<double>::operator=
                                  (&(this->_stage_metas).metersPerUnit,&local_1258);
                        nonstd::optional_lite::optional<double>::~optional(&local_1258);
                      }
                      else {
                        ::std::__cxx11::ostringstream::ostringstream(local_13d0);
                        poVar2 = ::std::operator<<((ostream *)local_13d0,"[error]");
                        poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                        poVar2 = ::std::operator<<(poVar2,":");
                        poVar2 = ::std::operator<<(poVar2,"ParseStageMetaOpt");
                        poVar2 = ::std::operator<<(poVar2,"():");
                        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x766);
                        ::std::operator<<(poVar2," ");
                        poVar2 = ::std::operator<<((ostream *)local_13d0,
                                                   "`metersPerUnit` isn\'t a floating-point value.")
                        ;
                        ::std::operator<<(poVar2,"\n");
                        ::std::__cxx11::ostringstream::str();
                        PushError(this,(string *)&pv_3);
                        ::std::__cxx11::string::~string((string *)&pv_3);
                        this_local._7_1_ = 0;
                        ::std::__cxx11::ostringstream::~ostringstream(local_13d0);
                      }
                      bVar1 = !bVar1;
                      nonstd::optional_lite::optional<double>::~optional
                                ((optional<double> *)local_1238);
                      if (!bVar1) goto LAB_005427a9;
                    }
                    nonstd::optional_lite::optional<float>::~optional(&local_1208);
                    if (bVar1) goto LAB_00543979;
                  }
                  else {
                    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)(msg.field_2._M_local_buf + 8),"kilogramsPerUnit");
                    if (bVar1) {
                      MetaVariable::get_value<float>(&local_1400,(MetaVariable *)local_420);
                      nonstd::optional_lite::optional<float>::optional<float,_0>
                                (&local_13f8,&local_1400);
                      nonstd::optional_lite::optional<float>::~optional(&local_1400);
                      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                        ((optional *)&local_13f8);
                      if (bVar1) {
                        pvVar3 = nonstd::optional_lite::optional<float>::value(&local_13f8);
                        pvd_1.contained = (storage_t<double>)(double)*pvVar3;
                        nonstd::optional_lite::optional<double>::optional<double,_0>
                                  (&local_1410,(double *)&pvd_1.contained);
                        nonstd::optional_lite::optional<double>::operator=
                                  (&(this->_stage_metas).kilogramsPerUnit,&local_1410);
                        nonstd::optional_lite::optional<double>::~optional(&local_1410);
LAB_00542a21:
                        bVar1 = false;
                      }
                      else {
                        MetaVariable::get_value<double>(&local_1438,(MetaVariable *)local_420);
                        nonstd::optional_lite::optional<double>::optional<double,_0>
                                  ((optional<double> *)local_1428,&local_1438);
                        nonstd::optional_lite::optional<double>::~optional(&local_1438);
                        bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                          ((optional *)local_1428);
                        if (bVar1) {
                          pvVar4 = nonstd::optional_lite::optional<double>::value
                                             ((optional<double> *)local_1428);
                          nonstd::optional_lite::optional<double>::optional<double_&,_0>
                                    (&local_1448,pvVar4);
                          nonstd::optional_lite::optional<double>::operator=
                                    (&(this->_stage_metas).kilogramsPerUnit,&local_1448);
                          nonstd::optional_lite::optional<double>::~optional(&local_1448);
                        }
                        else {
                          ::std::__cxx11::ostringstream::ostringstream(local_15c0);
                          poVar2 = ::std::operator<<((ostream *)local_15c0,"[error]");
                          poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                          poVar2 = ::std::operator<<(poVar2,":");
                          poVar2 = ::std::operator<<(poVar2,"ParseStageMetaOpt");
                          poVar2 = ::std::operator<<(poVar2,"():");
                          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x771);
                          ::std::operator<<(poVar2," ");
                          poVar2 = ::std::operator<<((ostream *)local_15c0,
                                                                                                          
                                                  "`kilogramsPerUnit` isn\'t a floating-point value."
                                                  );
                          ::std::operator<<(poVar2,"\n");
                          ::std::__cxx11::ostringstream::str();
                          PushError(this,(string *)&pv_4);
                          ::std::__cxx11::string::~string((string *)&pv_4);
                          this_local._7_1_ = 0;
                          ::std::__cxx11::ostringstream::~ostringstream(local_15c0);
                        }
                        bVar1 = !bVar1;
                        nonstd::optional_lite::optional<double>::~optional
                                  ((optional<double> *)local_1428);
                        if (!bVar1) goto LAB_00542a21;
                      }
                      nonstd::optional_lite::optional<float>::~optional(&local_13f8);
                      if (bVar1) goto LAB_00543979;
                    }
                    else {
                      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)(msg.field_2._M_local_buf + 8),
                                                "timeCodesPerSecond");
                      if (bVar1) {
                        MetaVariable::get_value<float>(&local_15f0,(MetaVariable *)local_420);
                        nonstd::optional_lite::optional<float>::optional<float,_0>
                                  (&local_15e8,&local_15f0);
                        nonstd::optional_lite::optional<float>::~optional(&local_15f0);
                        bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                          ((optional *)&local_15e8);
                        if (bVar1) {
                          pvVar3 = nonstd::optional_lite::optional<float>::value(&local_15e8);
                          pvd_2.contained = (storage_t<double>)(double)*pvVar3;
                          nonstd::optional_lite::optional<double>::optional<double,_0>
                                    (&local_1600,(double *)&pvd_2.contained);
                          nonstd::optional_lite::optional<double>::operator=
                                    (&(this->_stage_metas).timeCodesPerSecond,&local_1600);
                          nonstd::optional_lite::optional<double>::~optional(&local_1600);
LAB_00542c99:
                          bVar1 = false;
                        }
                        else {
                          MetaVariable::get_value<double>(&local_1628,(MetaVariable *)local_420);
                          nonstd::optional_lite::optional<double>::optional<double,_0>
                                    ((optional<double> *)local_1618,&local_1628);
                          nonstd::optional_lite::optional<double>::~optional(&local_1628);
                          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                            ((optional *)local_1618);
                          if (bVar1) {
                            pvVar4 = nonstd::optional_lite::optional<double>::value
                                               ((optional<double> *)local_1618);
                            nonstd::optional_lite::optional<double>::optional<double_&,_0>
                                      (&local_1638,pvVar4);
                            nonstd::optional_lite::optional<double>::operator=
                                      (&(this->_stage_metas).timeCodesPerSecond,&local_1638);
                            nonstd::optional_lite::optional<double>::~optional(&local_1638);
                          }
                          else {
                            ::std::__cxx11::ostringstream::ostringstream(local_17b0);
                            poVar2 = ::std::operator<<((ostream *)local_17b0,"[error]");
                            poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                            poVar2 = ::std::operator<<(poVar2,":");
                            poVar2 = ::std::operator<<(poVar2,"ParseStageMetaOpt");
                            poVar2 = ::std::operator<<(poVar2,"():");
                            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x77d);
                            ::std::operator<<(poVar2," ");
                            poVar2 = ::std::operator<<((ostream *)local_17b0,
                                                                                                              
                                                  "`timeCodesPerSecond` isn\'t a floating-point value."
                                                  );
                            ::std::operator<<(poVar2,"\n");
                            ::std::__cxx11::ostringstream::str();
                            PushError(this,(string *)&pv_5);
                            ::std::__cxx11::string::~string((string *)&pv_5);
                            this_local._7_1_ = 0;
                            ::std::__cxx11::ostringstream::~ostringstream(local_17b0);
                          }
                          bVar1 = !bVar1;
                          nonstd::optional_lite::optional<double>::~optional
                                    ((optional<double> *)local_1618);
                          if (!bVar1) goto LAB_00542c99;
                        }
                        nonstd::optional_lite::optional<float>::~optional(&local_15e8);
                        if (bVar1) goto LAB_00543979;
                      }
                      else {
                        bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(msg.field_2._M_local_buf + 8),"startTimeCode");
                        if (bVar1) {
                          MetaVariable::get_value<float>(&local_17e0,(MetaVariable *)local_420);
                          nonstd::optional_lite::optional<float>::optional<float,_0>
                                    (&local_17d8,&local_17e0);
                          nonstd::optional_lite::optional<float>::~optional(&local_17e0);
                          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                            ((optional *)&local_17d8);
                          if (bVar1) {
                            pvVar3 = nonstd::optional_lite::optional<float>::value(&local_17d8);
                            pvd_3.contained = (storage_t<double>)(double)*pvVar3;
                            nonstd::optional_lite::optional<double>::optional<double,_0>
                                      (&local_17f0,(double *)&pvd_3.contained);
                            nonstd::optional_lite::optional<double>::operator=
                                      (&(this->_stage_metas).startTimeCode,&local_17f0);
                            nonstd::optional_lite::optional<double>::~optional(&local_17f0);
                          }
                          else {
                            MetaVariable::get_value<double>(&local_1818,(MetaVariable *)local_420);
                            nonstd::optional_lite::optional<double>::optional<double,_0>
                                      ((optional<double> *)local_1808,&local_1818);
                            nonstd::optional_lite::optional<double>::~optional(&local_1818);
                            bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                              ((optional *)local_1808);
                            if (bVar1) {
                              pvVar4 = nonstd::optional_lite::optional<double>::value
                                                 ((optional<double> *)local_1808);
                              nonstd::optional_lite::optional<double>::optional<double_&,_0>
                                        ((optional<double> *)&pv_6,pvVar4);
                              nonstd::optional_lite::optional<double>::operator=
                                        (&(this->_stage_metas).startTimeCode,
                                         (optional<double> *)&pv_6);
                              nonstd::optional_lite::optional<double>::~optional
                                        ((optional<double> *)&pv_6);
                            }
                            nonstd::optional_lite::optional<double>::~optional
                                      ((optional<double> *)local_1808);
                          }
                          nonstd::optional_lite::optional<float>::~optional(&local_17d8);
                        }
                        else {
                          bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(msg.field_2._M_local_buf + 8),"endTimeCode");
                          if (bVar1) {
                            MetaVariable::get_value<float>(&local_1838,(MetaVariable *)local_420);
                            nonstd::optional_lite::optional<float>::optional<float,_0>
                                      (&local_1830,&local_1838);
                            nonstd::optional_lite::optional<float>::~optional(&local_1838);
                            bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                              ((optional *)&local_1830);
                            if (bVar1) {
                              pvVar3 = nonstd::optional_lite::optional<float>::value(&local_1830);
                              pvd_4.contained = (storage_t<double>)(double)*pvVar3;
                              nonstd::optional_lite::optional<double>::optional<double,_0>
                                        (&local_1848,(double *)&pvd_4.contained);
                              nonstd::optional_lite::optional<double>::operator=
                                        (&(this->_stage_metas).endTimeCode,&local_1848);
                              nonstd::optional_lite::optional<double>::~optional(&local_1848);
                            }
                            else {
                              MetaVariable::get_value<double>(&local_1870,(MetaVariable *)local_420)
                              ;
                              nonstd::optional_lite::optional<double>::optional<double,_0>
                                        ((optional<double> *)local_1860,&local_1870);
                              nonstd::optional_lite::optional<double>::~optional(&local_1870);
                              bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                                ((optional *)local_1860);
                              if (bVar1) {
                                pvVar4 = nonstd::optional_lite::optional<double>::value
                                                   ((optional<double> *)local_1860);
                                nonstd::optional_lite::optional<double>::optional<double_&,_0>
                                          ((optional<double> *)&pv_7,pvVar4);
                                nonstd::optional_lite::optional<double>::operator=
                                          (&(this->_stage_metas).endTimeCode,
                                           (optional<double> *)&pv_7);
                                nonstd::optional_lite::optional<double>::~optional
                                          ((optional<double> *)&pv_7);
                              }
                              nonstd::optional_lite::optional<double>::~optional
                                        ((optional<double> *)local_1860);
                            }
                            nonstd::optional_lite::optional<float>::~optional(&local_1830);
                          }
                          else {
                            bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(msg.field_2._M_local_buf + 8),"framesPerSecond"
                                                  );
                            if (bVar1) {
                              MetaVariable::get_value<float>(&local_1890,(MetaVariable *)local_420);
                              nonstd::optional_lite::optional<float>::optional<float,_0>
                                        (&local_1888,&local_1890);
                              nonstd::optional_lite::optional<float>::~optional(&local_1890);
                              bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                                ((optional *)&local_1888);
                              if (bVar1) {
                                pvVar3 = nonstd::optional_lite::optional<float>::value(&local_1888);
                                pvd_5.contained = (storage_t<double>)(double)*pvVar3;
                                nonstd::optional_lite::optional<double>::optional<double,_0>
                                          (&local_18a0,(double *)&pvd_5.contained);
                                nonstd::optional_lite::optional<double>::operator=
                                          (&(this->_stage_metas).framesPerSecond,&local_18a0);
                                nonstd::optional_lite::optional<double>::~optional(&local_18a0);
                              }
                              else {
                                MetaVariable::get_value<double>
                                          (&local_18c8,(MetaVariable *)local_420);
                                nonstd::optional_lite::optional<double>::optional<double,_0>
                                          ((optional<double> *)local_18b8,&local_18c8);
                                nonstd::optional_lite::optional<double>::~optional(&local_18c8);
                                bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                                  ((optional *)local_18b8);
                                if (bVar1) {
                                  pvVar4 = nonstd::optional_lite::optional<double>::value
                                                     ((optional<double> *)local_18b8);
                                  nonstd::optional_lite::optional<double>::optional<double_&,_0>
                                            ((optional<double> *)((long)&pv_8.contained + 0x10),
                                             pvVar4);
                                  nonstd::optional_lite::optional<double>::operator=
                                            (&(this->_stage_metas).framesPerSecond,
                                             (optional<double> *)((long)&pv_8.contained + 0x10));
                                  nonstd::optional_lite::optional<double>::~optional
                                            ((optional<double> *)((long)&pv_8.contained + 0x10));
                                }
                                nonstd::optional_lite::optional<double>::~optional
                                          ((optional<double> *)local_18b8);
                              }
                              nonstd::optional_lite::optional<float>::~optional(&local_1888);
                            }
                            else {
                              bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(msg.field_2._M_local_buf + 8),"apiSchemas");
                              if (bVar1) {
                                MetaVariable::
                                get_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                                          ((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                            *)&__range14,(MetaVariable *)local_420);
                                nonstd::optional_lite::
                                optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                ::
                                optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>,_0>
                                          ((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                            *)local_18f8,
                                           (optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                            *)&__range14);
                                nonstd::optional_lite::
                                optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                ::~optional((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                             *)&__range14);
                                bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                                  ((optional *)local_18f8);
                                if (bVar1) {
                                  this_01 = nonstd::optional_lite::
                                            optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                            ::value((
                                                  optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                                  *)local_18f8);
                                  __end14._M_current =
                                       (Token *)std::
                                                vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                ::begin((
                                                  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  *)this_01);
                                  item_1 = (Token *)std::
                                                  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ::end((
                                                  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  *)this_01);
                                  while (bVar1 = __gnu_cxx::operator!=
                                                           (&__end14,(
                                                  __normal_iterator<tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                                  *)&item_1), bVar1) {
                                    this_02 = __gnu_cxx::
                                              __normal_iterator<tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                              ::operator*(&__end14);
                                    psVar5 = Token::str_abi_cxx11_(this_02);
                                    bVar1 = IsSupportedAPISchema(this,psVar5);
                                    if (!bVar1) {
                                      ::std::__cxx11::ostringstream::ostringstream(local_1ab0);
                                      poVar2 = ::std::operator<<((ostream *)local_1ab0,"[error]");
                                      poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                      poVar2 = ::std::operator<<(poVar2,":");
                                      poVar2 = ::std::operator<<(poVar2,"ParseStageMetaOpt");
                                      poVar2 = ::std::operator<<(poVar2,"():");
                                      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x7a0);
                                      ::std::operator<<(poVar2," ");
                                      poVar2 = ::std::operator<<((ostream *)local_1ab0,"\"");
                                      psVar5 = Token::str_abi_cxx11_(this_02);
                                      poVar2 = ::std::operator<<(poVar2,(string *)psVar5);
                                      poVar2 = ::std::operator<<(poVar2,
                                                  "\" is not supported(at the moment) for `apiSchemas` in TinyUSDZ."
                                                  );
                                      ::std::operator<<(poVar2,"\n");
                                      ::std::__cxx11::ostringstream::str();
                                      PushError(this,&local_1ad0);
                                      ::std::__cxx11::string::~string((string *)&local_1ad0);
                                      this_local._7_1_ = 0;
                                      bVar1 = true;
                                      ::std::__cxx11::ostringstream::~ostringstream(local_1ab0);
                                      goto LAB_00543400;
                                    }
                                    __gnu_cxx::
                                    __normal_iterator<tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                    ::operator++(&__end14);
                                  }
                                  bVar1 = false;
                                }
                                else {
                                  ::std::__cxx11::ostringstream::ostringstream(local_1c48);
                                  poVar2 = ::std::operator<<((ostream *)local_1c48,"[error]");
                                  poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                  poVar2 = ::std::operator<<(poVar2,":");
                                  poVar2 = ::std::operator<<(poVar2,"ParseStageMetaOpt");
                                  poVar2 = ::std::operator<<(poVar2,"():");
                                  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x7a4);
                                  ::std::operator<<(poVar2," ");
                                  poVar2 = ::std::operator<<((ostream *)local_1c48,
                                                                                                                          
                                                  "`apiSchemas` isn\'t an `token[]` type.");
                                  ::std::operator<<(poVar2,"\n");
                                  ::std::__cxx11::ostringstream::str();
                                  PushError(this,(string *)((long)&pv_9.contained + 0x28));
                                  ::std::__cxx11::string::~string
                                            ((string *)((long)&pv_9.contained + 0x28));
                                  this_local._7_1_ = 0;
                                  bVar1 = true;
                                  ::std::__cxx11::ostringstream::~ostringstream(local_1c48);
                                }
LAB_00543400:
                                nonstd::optional_lite::
                                optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                ::~optional((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                             *)local_18f8);
                                if (bVar1) goto LAB_00543979;
                              }
                              else {
                                bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(msg.field_2._M_local_buf + 8),"customLayerData"
                                                  );
                                if (bVar1) {
                                  MetaVariable::
                                  get_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                                            (&local_1cd8,(MetaVariable *)local_420);
                                  nonstd::optional_lite::
                                  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                  ::
                                  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>,_0>
                                            ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                              *)local_1ca0,&local_1cd8);
                                  nonstd::optional_lite::
                                  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                  ::~optional(&local_1cd8);
                                  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                                    ((optional *)local_1ca0);
                                  if (bVar1) {
                                    pvVar6 = nonstd::optional_lite::
                                             optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                             ::value((
                                                  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                                  *)local_1ca0);
                                    std::
                                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                    ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                                 *)&(this->_stage_metas).customLayerData,
                                                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                                 *)pvVar6);
                                  }
                                  else {
                                    ::std::__cxx11::ostringstream::ostringstream(local_1e50);
                                    poVar2 = ::std::operator<<((ostream *)local_1e50,"[error]");
                                    poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                    poVar2 = ::std::operator<<(poVar2,":");
                                    poVar2 = ::std::operator<<(poVar2,"ParseStageMetaOpt");
                                    poVar2 = ::std::operator<<(poVar2,"():");
                                    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x7aa);
                                    ::std::operator<<(poVar2," ");
                                    poVar2 = ::std::operator<<((ostream *)local_1e50,
                                                                                                                              
                                                  "`customLayerData` isn\'t a dictionary value.");
                                    ::std::operator<<(poVar2,"\n");
                                    ::std::__cxx11::ostringstream::str();
                                    PushError(this,(string *)((long)&pv_10.contained + 0x28));
                                    ::std::__cxx11::string::~string
                                              ((string *)((long)&pv_10.contained + 0x28));
                                    this_local._7_1_ = 0;
                                    ::std::__cxx11::ostringstream::~ostringstream(local_1e50);
                                  }
                                  nonstd::optional_lite::
                                  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                  ::~optional((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                               *)local_1ca0);
                                  if (!bVar1) goto LAB_00543979;
                                }
                                else {
                                  bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(msg.field_2._M_local_buf + 8),"comment");
                                  if (bVar1) {
                                    MetaVariable::get_value<tinyusdz::value::StringData>
                                              ((optional<tinyusdz::value::StringData> *)
                                               ((long)&pvs_1.contained + 0x18),
                                               (MetaVariable *)local_420);
                                    nonstd::optional_lite::optional<tinyusdz::value::StringData>::
                                    optional<tinyusdz::value::StringData,_0>
                                              ((optional<tinyusdz::value::StringData> *)local_1ea8,
                                               (optional<tinyusdz::value::StringData> *)
                                               ((long)&pvs_1.contained + 0x18));
                                    nonstd::optional_lite::optional<tinyusdz::value::StringData>::
                                    ~optional((optional<tinyusdz::value::StringData> *)
                                              ((long)&pvs_1.contained + 0x18));
                                    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                                      ((optional *)local_1ea8);
                                    if (bVar1) {
                                      pvVar7 = nonstd::optional_lite::
                                               optional<tinyusdz::value::StringData>::value
                                                         ((optional<tinyusdz::value::StringData> *)
                                                          local_1ea8);
                                      tinyusdz::value::StringData::operator=
                                                (&(this->_stage_metas).comment,pvVar7);
LAB_00543848:
                                      bVar1 = false;
                                    }
                                    else {
                                      MetaVariable::get_value<std::__cxx11::string>
                                                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&sdata_1.line_col,(MetaVariable *)local_420);
                                      nonstd::optional_lite::
                                      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::
                                      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_1f08,
                                                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&sdata_1.line_col);
                                      nonstd::optional_lite::
                                      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::~optional((
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&sdata_1.line_col);
                                      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                                        ((optional *)local_1f08);
                                      if (bVar1) {
                                        tinyusdz::value::StringData::StringData
                                                  ((StringData *)local_1f60);
                                        psVar8 = (string *)
                                                 nonstd::optional_lite::
                                                 optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                 ::value((
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_1f08);
                                        ::std::__cxx11::string::operator=
                                                  ((string *)local_1f60,psVar8);
                                        sdata_1.value.field_2._M_local_buf[8] = '\0';
                                        tinyusdz::value::StringData::operator=
                                                  (&(this->_stage_metas).comment,
                                                   (StringData *)local_1f60);
                                        tinyusdz::value::StringData::~StringData
                                                  ((StringData *)local_1f60);
                                      }
                                      else {
                                        ::std::__cxx11::ostringstream::ostringstream(local_20d8);
                                        poVar2 = ::std::operator<<((ostream *)local_20d8,"[error]");
                                        poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                        poVar2 = ::std::operator<<(poVar2,":");
                                        poVar2 = ::std::operator<<(poVar2,"ParseStageMetaOpt");
                                        poVar2 = ::std::operator<<(poVar2,"():");
                                        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x7b6)
                                        ;
                                        ::std::operator<<(poVar2," ");
                                        ::std::allocator<char>::allocator();
                                        ::std::__cxx11::string::string
                                                  (local_2118,"`{}` isn\'t a string value.",
                                                   &local_2119);
                                        fmt::format<std::__cxx11::string>
                                                  (local_20f8,(string *)local_2118,
                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(msg.field_2._M_local_buf + 8));
                                        poVar2 = ::std::operator<<((ostream *)local_20d8,
                                                                   (string *)local_20f8);
                                        ::std::operator<<(poVar2,"\n");
                                        ::std::__cxx11::string::~string((string *)local_20f8);
                                        ::std::__cxx11::string::~string(local_2118);
                                        ::std::allocator<char>::~allocator
                                                  ((allocator<char> *)&local_2119);
                                        ::std::__cxx11::ostringstream::str();
                                        PushError(this,&local_2140);
                                        ::std::__cxx11::string::~string((string *)&local_2140);
                                        this_local._7_1_ = 0;
                                        ::std::__cxx11::ostringstream::~ostringstream(local_20d8);
                                      }
                                      bVar1 = !bVar1;
                                      nonstd::optional_lite::
                                      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::~optional((
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_1f08);
                                      if (!bVar1) goto LAB_00543848;
                                    }
                                    nonstd::optional_lite::optional<tinyusdz::value::StringData>::
                                    ~optional((optional<tinyusdz::value::StringData> *)local_1ea8);
                                    if (bVar1) goto LAB_00543979;
                                  }
                                  else {
                                    ::std::__cxx11::ostringstream::ostringstream(local_22b8);
                                    poVar2 = ::std::operator<<((ostream *)local_22b8,"[warn]");
                                    poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                    poVar2 = ::std::operator<<(poVar2,":");
                                    poVar2 = ::std::operator<<(poVar2,"ParseStageMetaOpt");
                                    poVar2 = ::std::operator<<(poVar2,"():");
                                    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x7ba);
                                    ::std::operator<<(poVar2," ");
                                    poVar2 = ::std::operator<<((ostream *)local_22b8,
                                                               "TODO: Stage meta: ");
                                    poVar2 = ::std::operator<<(poVar2,(string *)
                                                                      (msg.field_2._M_local_buf + 8)
                                                              );
                                    ::std::operator<<(poVar2,"\n");
                                    ::std::__cxx11::ostringstream::str();
                                    PushWarn(this,&local_22d8);
                                    ::std::__cxx11::string::~string((string *)&local_22d8);
                                    ::std::__cxx11::ostringstream::~ostringstream(local_22b8);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
LAB_0054396e:
              this_local._7_1_ = 1;
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_598);
            poVar2 = ::std::operator<<((ostream *)local_598,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ParseStageMetaOpt");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x71d);
            ::std::operator<<(poVar2," ");
            poVar2 = ::std::operator<<((ostream *)local_598,"Failed to parse meta value.\n");
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)((long)&tok.str_.field_2 + 8));
            ::std::__cxx11::string::~string((string *)(tok.str_.field_2._M_local_buf + 8));
            this_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_598);
          }
LAB_00543979:
          MetaVariable::~MetaVariable((MetaVariable *)local_420);
        }
        else {
          this_local._7_1_ = 0;
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_3c0);
        poVar2 = ::std::operator<<((ostream *)local_3c0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseStageMetaOpt");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x712);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_3c0,"\'=\' expected in Stage Metadata opt.");
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&vardef);
        ::std::__cxx11::string::~string((string *)&vardef);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_3c0);
      }
    }
    else {
      ::std::operator+((char *)local_b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5e4e66
                      );
      ::std::operator+(local_90,(char *)local_b0);
      ::std::__cxx11::string::~string(local_b0);
      ::std::__cxx11::ostringstream::ostringstream(local_228);
      poVar2 = ::std::operator<<((ostream *)local_228,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseStageMetaOpt");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x70d);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_228,(string *)local_90);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_248);
      ::std::__cxx11::string::~string((string *)&local_248);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_228);
      ::std::__cxx11::string::~string((string *)local_90);
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  ::std::__cxx11::string::~string((string *)(msg.field_2._M_local_buf + 8));
LAB_0054398e:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ParseStageMetaOpt() {
  // Maybe string-only comment.
  // Comment cannot have multiple lines. The last one wins
  {
    value::StringData str;
    if (MaybeTripleQuotedString(&str)) {
      _stage_metas.comment = str;
      return true;
    } else if (MaybeString(&str)) {
      _stage_metas.comment = str;
      return true;
    }
  }

  std::string varname;
  if (!ReadIdentifier(&varname)) {
    return false;
  }

  DCOUT("varname = " << varname);

  if (!IsStageMeta(varname)) {
    std::string msg = "'" + varname + "' is not a Stage Metadata variable.\n";
    PUSH_ERROR_AND_RETURN(msg);
    return false;
  }

  if (!Expect('=')) {
    PUSH_ERROR_AND_RETURN("'=' expected in Stage Metadata opt.");
    return false;
  }

  if (!SkipWhitespace()) {
    return false;
  }

  const VariableDef &vardef = _supported_stage_metas.at(varname);
  MetaVariable var;
  if (!ParseMetaValue(vardef, &var)) {
    PUSH_ERROR_AND_RETURN("Failed to parse meta value.\n");
    return false;
  }
  var.set_name(varname);

  if (varname == "defaultPrim") {
    value::token tok;
    if (var.get_value(&tok)) {
      DCOUT("defaultPrim = " << tok);
      _stage_metas.defaultPrim = tok;
    } else {
      PUSH_ERROR_AND_RETURN("`defaultPrim` isn't a token value.");
    }
  } else if (varname == "subLayers") {
    std::vector<value::AssetPath> paths;
    if (var.get_value(&paths)) {
      DCOUT("subLayers = " << paths);
      for (const auto &item : paths) {
        _stage_metas.subLayers.push_back(item);
      }
    } else {
      PUSH_ERROR_AND_RETURN("`subLayers` isn't an array of asset path");
    }
  } else if (varname == "upAxis") {
    if (auto pv = var.get_value<value::token>()) {
      DCOUT("upAxis = " << pv.value());
      const std::string s = pv.value().str();
      if (s == "X") {
        _stage_metas.upAxis = Axis::X;
      } else if (s == "Y") {
        _stage_metas.upAxis = Axis::Y;
      } else if (s == "Z") {
        _stage_metas.upAxis = Axis::Z;
      } else {
        if (_option.strict_allowedToken_check) {
          PUSH_ERROR_AND_RETURN(
              "Invalid `upAxis` value. Must be \"X\", \"Y\" or \"Z\", but got "
              "\"" +
              s + "\"(Note: Case sensitive)");
        } else {
          PUSH_WARN(
              "Ignore unknown `upAxis` value. Must be \"X\", \"Y\" or \"Z\", "
              "but got "
              "\"" +
              s + "\"(Note: Case sensitive). Use default upAxis `Y`.");
          _stage_metas.upAxis = Axis::Y;
        }
      }
    } else {
      PUSH_ERROR_AND_RETURN("`upAxis` isn't a token value.");
    }
  } else if ((varname == "doc") || (varname == "documentation")) {
    // `documentation` will be shorten to `doc`
    if (auto pv = var.get_value<value::StringData>()) {
      DCOUT("doc = " << to_string(pv.value()));
      _stage_metas.doc = pv.value();
    } else if (auto pvs = var.get_value<std::string>()) {
      value::StringData sdata;
      sdata.value = pvs.value();
      sdata.is_triple_quoted = false;
      _stage_metas.doc = sdata;
    } else {
      PUSH_ERROR_AND_RETURN(fmt::format("`{}` isn't a string value.", varname));
    }
  } else if (varname == "metersPerUnit") {
    DCOUT("ty = " << var.type_name());
    if (auto pv = var.get_value<float>()) {
      DCOUT("metersPerUnit = " << pv.value());
      _stage_metas.metersPerUnit = double(pv.value());
    } else if (auto pvd = var.get_value<double>()) {
      DCOUT("metersPerUnit = " << pvd.value());
      _stage_metas.metersPerUnit = pvd.value();
    } else {
      PUSH_ERROR_AND_RETURN("`metersPerUnit` isn't a floating-point value.");
    }
  } else if (varname == "kilogramsPerUnit") {
    DCOUT("ty = " << var.type_name());
    if (auto pv = var.get_value<float>()) {
      DCOUT("kilogramsPerUnit = " << pv.value());
      _stage_metas.kilogramsPerUnit = double(pv.value());
    } else if (auto pvd = var.get_value<double>()) {
      DCOUT("kilogramsPerUnit = " << pvd.value());
      _stage_metas.kilogramsPerUnit = pvd.value();
    } else {
      PUSH_ERROR_AND_RETURN("`kilogramsPerUnit` isn't a floating-point value.");
    }
  } else if (varname == "timeCodesPerSecond") {
    DCOUT("ty = " << var.type_name());
    if (auto pv = var.get_value<float>()) {
      DCOUT("metersPerUnit = " << pv.value());
      _stage_metas.timeCodesPerSecond = double(pv.value());
    } else if (auto pvd = var.get_value<double>()) {
      DCOUT("metersPerUnit = " << pvd.value());
      _stage_metas.timeCodesPerSecond = pvd.value();
    } else {
      PUSH_ERROR_AND_RETURN(
          "`timeCodesPerSecond` isn't a floating-point value.");
    }
  } else if (varname == "startTimeCode") {
    if (auto pv = var.get_value<float>()) {
      DCOUT("startTimeCode = " << pv.value());
      _stage_metas.startTimeCode = double(pv.value());
    } else if (auto pvd = var.get_value<double>()) {
      DCOUT("startTimeCode = " << pvd.value());
      _stage_metas.startTimeCode = pvd.value();
    }
  } else if (varname == "endTimeCode") {
    if (auto pv = var.get_value<float>()) {
      DCOUT("endTimeCode = " << pv.value());
      _stage_metas.endTimeCode = double(pv.value());
    } else if (auto pvd = var.get_value<double>()) {
      DCOUT("endTimeCode = " << pvd.value());
      _stage_metas.endTimeCode = pvd.value();
    }
  } else if (varname == "framesPerSecond") {
    if (auto pv = var.get_value<float>()) {
      DCOUT("framesPerSecond = " << pv.value());
      _stage_metas.framesPerSecond = double(pv.value());
    } else if (auto pvd = var.get_value<double>()) {
      DCOUT("framesPerSecond = " << pvd.value());
      _stage_metas.framesPerSecond = pvd.value();
    }
  } else if (varname == "apiSchemas") {
    // TODO: ListEdit qualifer check
    if (auto pv = var.get_value<std::vector<value::token>>()) {
      for (auto &item : pv.value()) {
        if (IsSupportedAPISchema(item.str())) {
          // OK
        } else {
          PUSH_ERROR_AND_RETURN("\"" << item.str()
                                     << "\" is not supported(at the moment) "
                                        "for `apiSchemas` in TinyUSDZ.");
        }
      }
    } else {
      PUSH_ERROR_AND_RETURN("`apiSchemas` isn't an `token[]` type.");
    }
  } else if (varname == "customLayerData") {
    if (auto pv = var.get_value<Dictionary>()) {
      _stage_metas.customLayerData = pv.value();
    } else {
      PUSH_ERROR_AND_RETURN("`customLayerData` isn't a dictionary value.");
    }
  } else if (varname == "comment") {
    if (auto pv = var.get_value<value::StringData>()) {
      DCOUT("comment = " << to_string(pv.value()));
      _stage_metas.comment = pv.value();
    } else if (auto pvs = var.get_value<std::string>()) {
      value::StringData sdata;
      sdata.value = pvs.value();
      sdata.is_triple_quoted = false;
      _stage_metas.comment = sdata;
    } else {
      PUSH_ERROR_AND_RETURN(fmt::format("`{}` isn't a string value.", varname));
    }
  } else {
    DCOUT("TODO: Stage meta: " << varname);
    PUSH_WARN("TODO: Stage meta: " << varname);
  }

  return true;
}